

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxconvenience.cpp
# Opt level: O2

void qglx_surfaceFormatFromGLXFBConfig
               (QSurfaceFormat *format,Display *display,GLXFBConfig config,int flags)

{
  long in_FS_OFFSET;
  QColorSpace local_68;
  int srgbCapable;
  int stereo;
  int sampleCount;
  int sampleBuffers;
  int stencilSize;
  int depthSize;
  int alphaSize;
  int blueSize;
  int greenSize;
  int redSize;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  redSize = 0;
  greenSize = 0;
  blueSize = 0;
  alphaSize = 0;
  depthSize = 0;
  stencilSize = 0;
  sampleBuffers = 0;
  sampleCount = 0;
  stereo = 0;
  srgbCapable = 0;
  glXGetFBConfigAttrib(display,config,8);
  glXGetFBConfigAttrib(display,config,9,&greenSize);
  glXGetFBConfigAttrib(display,config,10,&blueSize);
  glXGetFBConfigAttrib(display,config,0xb,&alphaSize);
  glXGetFBConfigAttrib(display,config,0xc,&depthSize);
  glXGetFBConfigAttrib(display,config,0xd,&stencilSize);
  glXGetFBConfigAttrib(display,config,100000,&sampleBuffers);
  glXGetFBConfigAttrib(display,config,6,&stereo);
  if ((flags & 1U) != 0) {
    glXGetFBConfigAttrib(display,config,0x20b2,&srgbCapable);
  }
  QSurfaceFormat::setRedBufferSize(format,redSize);
  QSurfaceFormat::setGreenBufferSize(format,greenSize);
  QSurfaceFormat::setBlueBufferSize(format,blueSize);
  QSurfaceFormat::setAlphaBufferSize(format,alphaSize);
  QSurfaceFormat::setDepthBufferSize(format,depthSize);
  QSurfaceFormat::setStencilBufferSize(format,stencilSize);
  if (sampleBuffers != 0) {
    glXGetFBConfigAttrib(display,config,0x186a1,&sampleCount);
    QSurfaceFormat::setSamples(format,sampleCount);
  }
  if (srgbCapable == 0) {
    local_68.d_ptr.d.ptr =
         (QExplicitlySharedDataPointer<QColorSpacePrivate>)
         (totally_ordered_wrapper<QColorSpacePrivate_*>)0x0;
  }
  else {
    QColorSpace::QColorSpace(&local_68,SRgb);
  }
  QSurfaceFormat::setColorSpace(format,&local_68);
  QColorSpace::~QColorSpace(&local_68);
  QSurfaceFormat::setStereo(format,stereo != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qglx_surfaceFormatFromGLXFBConfig(QSurfaceFormat *format, Display *display, GLXFBConfig config, int flags)
{
    int redSize     = 0;
    int greenSize   = 0;
    int blueSize    = 0;
    int alphaSize   = 0;
    int depthSize   = 0;
    int stencilSize = 0;
    int sampleBuffers = 0;
    int sampleCount = 0;
    int stereo      = 0;
    int srgbCapable = 0;

    glXGetFBConfigAttrib(display, config, GLX_RED_SIZE,     &redSize);
    glXGetFBConfigAttrib(display, config, GLX_GREEN_SIZE,   &greenSize);
    glXGetFBConfigAttrib(display, config, GLX_BLUE_SIZE,    &blueSize);
    glXGetFBConfigAttrib(display, config, GLX_ALPHA_SIZE,   &alphaSize);
    glXGetFBConfigAttrib(display, config, GLX_DEPTH_SIZE,   &depthSize);
    glXGetFBConfigAttrib(display, config, GLX_STENCIL_SIZE, &stencilSize);
    glXGetFBConfigAttrib(display, config, GLX_SAMPLE_BUFFERS_ARB, &sampleBuffers);
    glXGetFBConfigAttrib(display, config, GLX_STEREO,       &stereo);
    if (flags & QGLX_SUPPORTS_SRGB)
        glXGetFBConfigAttrib(display, config, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &srgbCapable);

    format->setRedBufferSize(redSize);
    format->setGreenBufferSize(greenSize);
    format->setBlueBufferSize(blueSize);
    format->setAlphaBufferSize(alphaSize);
    format->setDepthBufferSize(depthSize);
    format->setStencilBufferSize(stencilSize);
    if (sampleBuffers) {
        glXGetFBConfigAttrib(display, config, GLX_SAMPLES_ARB, &sampleCount);
        format->setSamples(sampleCount);
    }
    if (srgbCapable)
        format->setColorSpace(QColorSpace::SRgb);
    else
        format->setColorSpace(QColorSpace());

    format->setStereo(stereo);
}